

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O2

void __thiscall ktx::PrintDiff::endJsonSection(PrintDiff *this)

{
  char *nl;
  
  if ((this->jsonSection).
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    nl = "\n";
    if (this->outputFormat == json_mini) {
      nl = "";
    }
    if (this->jsonSectionEmpty == false) {
      PrintIndent::operator()(this->printIndent,0,(char (*) [3])0x1dcb84,&nl);
      PrintIndent::operator()(this->printIndent,1,(char (*) [3])0x1d0ec9);
    }
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&this->jsonSection);
  }
  return;
}

Assistant:

void endJsonSection() {
        if (jsonSection.has_value()) {
            const auto nl = outputFormat != OutputFormat::json_mini ?  "\n" : "";
            if (!jsonSectionEmpty) {
                printIndent(0, "{}", nl);
                printIndent(1, "}}");
            }
            jsonSection.reset();
        }
    }